

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_display.cxx
# Opt level: O0

void Fl::display(char *d)

{
  char *local_18;
  char *c;
  char *d_local;
  
  strcpy(display::e,"DISPLAY=");
  fl_strlcat(display::e,d,0x400);
  local_18 = display::e + 8;
  do {
    if (*local_18 == ':') {
LAB_002385a2:
      putenv(display::e);
      return;
    }
    if (*local_18 == '\0') {
      fl_strlcat(display::e,":0.0",0x400);
      goto LAB_002385a2;
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

void Fl::display(const char *d) {
#if defined(__APPLE__) || defined(WIN32)
  (void)d;
#else
  static char e[1024];
  strcpy(e,"DISPLAY=");
  strlcat(e,d,sizeof(e));
  for (char *c = e+8; *c!=':'; c++) {
    if (!*c) {
      strlcat(e,":0.0",sizeof(e));
      break;
    }
  }
  putenv(e);
#endif // __APPLE__
}